

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bvh_intersector_hybrid.cpp
# Opt level: O2

bool embree::avx2::
     BVHNIntersectorKHybrid<4,_8,_1,_true,_embree::avx2::SubdivPatch1IntersectorK<8>,_true>::
     occluded1(Intersectors *This,BVH *bvh,NodeRef root,size_t k,Precalculations *pre,RayK<8> *ray,
              TravRayK<8,_true> *tray,RayQueryContext *context)

{
  undefined4 uVar1;
  float fVar2;
  float fVar3;
  float fVar4;
  float fVar5;
  undefined4 uVar6;
  uint uVar7;
  uint uVar8;
  RTCFilterFunctionN p_Var9;
  float fVar10;
  float fVar11;
  float fVar12;
  float fVar13;
  float fVar14;
  float fVar15;
  float fVar16;
  float fVar17;
  float fVar18;
  float fVar19;
  float fVar20;
  float fVar21;
  float fVar22;
  float fVar23;
  float fVar24;
  float fVar25;
  float fVar26;
  undefined1 auVar27 [32];
  undefined1 auVar28 [16];
  undefined1 auVar29 [32];
  undefined1 auVar30 [32];
  undefined1 auVar31 [32];
  undefined1 auVar32 [32];
  undefined1 auVar33 [32];
  undefined1 auVar34 [32];
  undefined1 auVar35 [32];
  undefined1 auVar36 [32];
  undefined1 auVar37 [32];
  undefined1 auVar38 [32];
  undefined1 auVar39 [32];
  undefined1 auVar40 [32];
  undefined1 auVar41 [32];
  undefined1 auVar42 [32];
  undefined1 auVar43 [32];
  undefined1 auVar44 [32];
  undefined1 auVar45 [32];
  undefined1 auVar46 [32];
  int iVar47;
  uint uVar48;
  ulong uVar49;
  long lVar50;
  ulong uVar51;
  ulong uVar52;
  GridSOA *pGVar53;
  ulong uVar54;
  GridSOA *pGVar55;
  Geometry *pGVar56;
  ulong *puVar57;
  ulong uVar58;
  ulong uVar59;
  undefined1 auVar60 [16];
  undefined1 auVar61 [32];
  undefined1 auVar62 [32];
  undefined1 auVar63 [32];
  undefined1 auVar64 [32];
  undefined1 auVar65 [32];
  undefined1 auVar66 [32];
  undefined1 auVar67 [16];
  undefined1 auVar68 [16];
  undefined1 auVar69 [16];
  undefined1 auVar70 [32];
  undefined1 auVar71 [32];
  undefined1 auVar72 [16];
  undefined1 auVar73 [16];
  undefined1 auVar74 [32];
  undefined1 auVar75 [32];
  undefined1 auVar76 [32];
  undefined1 auVar77 [32];
  undefined1 auVar78 [32];
  undefined1 auVar79 [32];
  undefined1 auVar80 [32];
  undefined1 auVar81 [16];
  undefined1 auVar82 [32];
  undefined1 auVar83 [32];
  undefined1 auVar84 [32];
  undefined1 auVar85 [32];
  undefined1 auVar86 [16];
  undefined1 auVar87 [16];
  undefined1 auVar88 [32];
  undefined1 auVar89 [32];
  float fVar90;
  float fVar96;
  float fVar97;
  undefined1 auVar91 [16];
  float fVar99;
  float fVar100;
  float fVar101;
  undefined1 auVar92 [32];
  float fVar98;
  undefined1 auVar93 [32];
  undefined1 auVar94 [32];
  undefined1 auVar95 [32];
  undefined1 auVar102 [16];
  undefined1 auVar103 [32];
  undefined1 auVar104 [32];
  undefined1 auVar105 [32];
  undefined1 auVar106 [32];
  undefined1 auVar107 [32];
  undefined1 auVar108 [16];
  undefined1 auVar109 [32];
  undefined1 auVar110 [32];
  undefined1 auVar111 [32];
  undefined1 auVar112 [32];
  undefined1 auVar113 [32];
  undefined1 auVar114 [32];
  float fVar115;
  float fVar116;
  float fVar117;
  float fVar118;
  float fVar119;
  float fVar120;
  float fVar121;
  float fVar122;
  float fVar123;
  float fVar124;
  float fVar125;
  float fVar126;
  float fVar127;
  float fVar128;
  RTCFilterFunctionNArguments args;
  float old_t;
  NodeRef stack [244];
  ulong *local_dc0;
  GridSOA *local_cb8;
  ulong local_cb0;
  ulong local_ca8;
  undefined1 local_ca0 [32];
  ulong local_c68;
  undefined8 local_c60;
  undefined8 uStack_c58;
  undefined8 uStack_c50;
  undefined8 uStack_c48;
  RTCFilterFunctionNArguments local_c30;
  Geometry *local_c00;
  undefined1 auStack_bf8 [24];
  undefined1 local_be0 [32];
  undefined1 local_bc0 [32];
  undefined1 local_ba0 [32];
  undefined1 local_b80 [32];
  undefined1 local_b60 [32];
  undefined1 local_b40 [32];
  undefined1 local_b20 [32];
  undefined1 local_b00 [32];
  undefined1 local_ae0 [32];
  undefined1 local_ac0 [32];
  undefined1 local_aa0 [32];
  undefined8 local_a80;
  undefined8 uStack_a78;
  undefined8 uStack_a70;
  undefined8 uStack_a68;
  float local_a60;
  float fStack_a5c;
  float fStack_a58;
  float fStack_a54;
  undefined4 uStack_a50;
  undefined4 uStack_a4c;
  undefined4 uStack_a48;
  undefined4 uStack_a44;
  undefined1 local_a40 [32];
  GridSOA **local_a20;
  undefined1 local_a00 [32];
  undefined1 local_9e0 [32];
  float local_9c0 [4];
  float fStack_9b0;
  float fStack_9ac;
  float fStack_9a8;
  float fStack_9a4;
  undefined1 local_9a0 [32];
  undefined1 local_980 [32];
  undefined1 local_960 [32];
  undefined1 local_940 [32];
  RTCHitN local_920 [32];
  undefined1 local_900 [32];
  undefined1 local_8e0 [32];
  float local_8c0;
  float fStack_8bc;
  float fStack_8b8;
  float fStack_8b4;
  float fStack_8b0;
  float fStack_8ac;
  float fStack_8a8;
  float fStack_8a4;
  float local_8a0;
  float fStack_89c;
  float fStack_898;
  float fStack_894;
  float fStack_890;
  float fStack_88c;
  float fStack_888;
  float fStack_884;
  undefined8 local_880;
  undefined8 uStack_878;
  undefined8 uStack_870;
  undefined8 uStack_868;
  undefined8 local_860;
  undefined8 uStack_858;
  undefined8 uStack_850;
  undefined8 uStack_848;
  uint local_840;
  uint uStack_83c;
  uint uStack_838;
  uint uStack_834;
  uint uStack_830;
  uint uStack_82c;
  uint uStack_828;
  uint uStack_824;
  uint local_820;
  uint uStack_81c;
  uint uStack_818;
  uint uStack_814;
  uint uStack_810;
  uint uStack_80c;
  uint uStack_808;
  uint uStack_804;
  size_t local_800;
  ulong local_7f8 [249];
  
  local_800 = root.ptr;
  uVar1 = *(undefined4 *)((long)&(tray->org).field_0 + k * 4);
  auVar81._4_4_ = uVar1;
  auVar81._0_4_ = uVar1;
  auVar81._8_4_ = uVar1;
  auVar81._12_4_ = uVar1;
  uVar1 = *(undefined4 *)((long)&(tray->org).field_0 + k * 4 + 0x20);
  auVar86._4_4_ = uVar1;
  auVar86._0_4_ = uVar1;
  auVar86._8_4_ = uVar1;
  auVar86._12_4_ = uVar1;
  uVar1 = *(undefined4 *)((long)&(tray->org).field_0 + k * 4 + 0x40);
  auVar108._4_4_ = uVar1;
  auVar108._0_4_ = uVar1;
  auVar108._8_4_ = uVar1;
  auVar108._12_4_ = uVar1;
  fVar2 = *(float *)((long)&(tray->rdir).field_0 + k * 4);
  fVar3 = *(float *)((long)&(tray->rdir).field_0 + k * 4 + 0x20);
  fVar4 = *(float *)((long)&(tray->rdir).field_0 + k * 4 + 0x40);
  fVar24 = fVar2 * 0.99999964;
  fVar25 = fVar3 * 0.99999964;
  fVar26 = fVar4 * 0.99999964;
  fVar2 = fVar2 * 1.0000004;
  fVar3 = fVar3 * 1.0000004;
  fVar4 = fVar4 * 1.0000004;
  local_c68 = (ulong)*(int *)((long)&(tray->nearXYZ).field_0 + k * 4);
  uVar59 = (ulong)*(int *)((long)&(tray->nearXYZ).field_0 + k * 4 + 0x20);
  uVar51 = (ulong)*(int *)((long)&(tray->nearXYZ).field_0 + k * 4 + 0x40);
  uVar58 = local_c68 ^ 0x10;
  iVar47 = (tray->tnear).field_0.i[k];
  auVar91._4_4_ = iVar47;
  auVar91._0_4_ = iVar47;
  auVar91._8_4_ = iVar47;
  auVar91._12_4_ = iVar47;
  iVar47 = (tray->tfar).field_0.i[k];
  auVar102._4_4_ = iVar47;
  auVar102._0_4_ = iVar47;
  auVar102._8_4_ = iVar47;
  auVar102._12_4_ = iVar47;
  iVar47 = 1 << ((uint)k & 0x1f);
  auVar61._4_4_ = iVar47;
  auVar61._0_4_ = iVar47;
  auVar61._8_4_ = iVar47;
  auVar61._12_4_ = iVar47;
  auVar61._16_4_ = iVar47;
  auVar61._20_4_ = iVar47;
  auVar61._24_4_ = iVar47;
  auVar61._28_4_ = iVar47;
  auVar62 = vpmovzxbd_avx2(ZEXT816(0x8040201008040201));
  auVar61 = vpand_avx2(auVar61,auVar62);
  local_b40 = vpcmpeqd_avx2(auVar61,auVar62);
  local_dc0 = local_7f8;
LAB_01618fa2:
  do {
    puVar57 = local_dc0;
    if (puVar57 == &local_800) {
LAB_01619c81:
      return puVar57 != &local_800;
    }
    local_dc0 = puVar57 + -1;
    uVar52 = puVar57[-1];
    while ((uVar52 & 8) == 0) {
      auVar28 = vsubps_avx(*(undefined1 (*) [16])(uVar52 + 0x20 + local_c68),auVar81);
      auVar60._0_4_ = fVar24 * auVar28._0_4_;
      auVar60._4_4_ = fVar24 * auVar28._4_4_;
      auVar60._8_4_ = fVar24 * auVar28._8_4_;
      auVar60._12_4_ = fVar24 * auVar28._12_4_;
      auVar28 = vsubps_avx(*(undefined1 (*) [16])(uVar52 + 0x20 + uVar59),auVar86);
      auVar67._0_4_ = fVar25 * auVar28._0_4_;
      auVar67._4_4_ = fVar25 * auVar28._4_4_;
      auVar67._8_4_ = fVar25 * auVar28._8_4_;
      auVar67._12_4_ = fVar25 * auVar28._12_4_;
      auVar28 = vmaxps_avx(auVar60,auVar67);
      auVar60 = vsubps_avx(*(undefined1 (*) [16])(uVar52 + 0x20 + uVar51),auVar108);
      auVar68._0_4_ = fVar26 * auVar60._0_4_;
      auVar68._4_4_ = fVar26 * auVar60._4_4_;
      auVar68._8_4_ = fVar26 * auVar60._8_4_;
      auVar68._12_4_ = fVar26 * auVar60._12_4_;
      auVar60 = vmaxps_avx(auVar68,auVar91);
      auVar28 = vmaxps_avx(auVar28,auVar60);
      auVar60 = vsubps_avx(*(undefined1 (*) [16])(uVar52 + 0x20 + uVar58),auVar81);
      auVar69._0_4_ = fVar2 * auVar60._0_4_;
      auVar69._4_4_ = fVar2 * auVar60._4_4_;
      auVar69._8_4_ = fVar2 * auVar60._8_4_;
      auVar69._12_4_ = fVar2 * auVar60._12_4_;
      auVar60 = vsubps_avx(*(undefined1 (*) [16])(uVar52 + 0x20 + (uVar59 ^ 0x10)),auVar86);
      auVar72._0_4_ = fVar3 * auVar60._0_4_;
      auVar72._4_4_ = fVar3 * auVar60._4_4_;
      auVar72._8_4_ = fVar3 * auVar60._8_4_;
      auVar72._12_4_ = fVar3 * auVar60._12_4_;
      auVar60 = vminps_avx(auVar69,auVar72);
      auVar67 = vsubps_avx(*(undefined1 (*) [16])(uVar52 + 0x20 + (uVar51 ^ 0x10)),auVar108);
      auVar73._0_4_ = fVar4 * auVar67._0_4_;
      auVar73._4_4_ = fVar4 * auVar67._4_4_;
      auVar73._8_4_ = fVar4 * auVar67._8_4_;
      auVar73._12_4_ = fVar4 * auVar67._12_4_;
      auVar67 = vminps_avx(auVar73,auVar102);
      auVar60 = vminps_avx(auVar60,auVar67);
      auVar28 = vcmpps_avx(auVar28,auVar60,2);
      uVar48 = vmovmskps_avx(auVar28);
      if (uVar48 == 0) goto LAB_01618fa2;
      uVar48 = uVar48 & 0xff;
      uVar49 = uVar52 & 0xfffffffffffffff0;
      lVar50 = 0;
      for (uVar52 = (ulong)uVar48; (uVar52 & 1) == 0; uVar52 = uVar52 >> 1 | 0x8000000000000000) {
        lVar50 = lVar50 + 1;
      }
      uVar52 = *(ulong *)(uVar49 + lVar50 * 8);
      uVar48 = uVar48 - 1 & uVar48;
      uVar54 = (ulong)uVar48;
      if (uVar48 != 0) {
        do {
          *local_dc0 = uVar52;
          local_dc0 = local_dc0 + 1;
          lVar50 = 0;
          for (uVar52 = uVar54; (uVar52 & 1) == 0; uVar52 = uVar52 >> 1 | 0x8000000000000000) {
            lVar50 = lVar50 + 1;
          }
          uVar54 = uVar54 - 1 & uVar54;
          uVar52 = *(ulong *)(uVar49 + lVar50 * 8);
        } while (uVar54 != 0);
      }
    }
    if (((uint)uVar52 & 0xf) == 8) {
      pGVar53 = (pre->super_Precalculations).grid;
      uVar48 = *(uint *)(pGVar53 + 0xc);
      local_cb0 = (ulong)uVar48;
      uVar7 = *(uint *)(pGVar53 + 0x10);
      local_ca8 = (ulong)uVar7;
      uVar8 = *(uint *)(pGVar53 + 0x24);
      uVar52 = uVar52 >> 4;
      lVar50 = uVar52 * 4 + (ulong)uVar8;
      auVar28 = *(undefined1 (*) [16])(pGVar53 + local_cb0 * 4 + lVar50 + 0x2c);
      auVar60 = auVar28;
      if (2 < local_ca8) {
        auVar60 = *(undefined1 (*) [16])(pGVar53 + local_cb0 * 8 + uVar52 * 4 + (ulong)uVar8 + 0x2c)
        ;
      }
      auVar67 = *(undefined1 (*) [16])(pGVar53 + uVar52 * 4 + (ulong)uVar8 + 0x2c);
      if (local_cb0 == 2) {
        auVar67 = vshufps_avx(auVar67,auVar67,0x54);
        auVar28 = vshufps_avx(auVar28,auVar28,0x54);
        auVar60 = vshufps_avx(auVar60,auVar60,0x54);
      }
      uVar52 = (ulong)*(uint *)(pGVar53 + 0x14);
      pGVar55 = pGVar53 + uVar52 * 4 + lVar50 + 0x2c;
      auVar68 = *(undefined1 (*) [16])(pGVar55 + local_cb0 * 4);
      auVar69 = auVar68;
      if (2 < uVar7) {
        auVar69 = *(undefined1 (*) [16])(pGVar55 + local_cb0 * 8);
      }
      auVar72 = *(undefined1 (*) [16])pGVar55;
      if (uVar48 == 2) {
        auVar72 = vshufps_avx(auVar72,auVar72,0x54);
        auVar68 = vshufps_avx(auVar68,auVar68,0x54);
        auVar69 = vshufps_avx(auVar69,auVar69,0x54);
      }
      pGVar55 = pGVar53 + uVar52 * 8 + lVar50 + 0x2c;
      auVar73 = *(undefined1 (*) [16])(pGVar55 + local_cb0 * 4);
      auVar87 = auVar73;
      if (2 < uVar7) {
        auVar87 = *(undefined1 (*) [16])(pGVar55 + local_cb0 * 8);
      }
      auVar103._16_16_ = auVar28;
      auVar103._0_16_ = auVar67;
      auVar62._16_16_ = auVar60;
      auVar62._0_16_ = auVar28;
      auVar71 = vunpcklps_avx(auVar103,auVar62);
      auVar61 = vshufps_avx(auVar103,auVar103,0xa5);
      auVar62 = vshufps_avx(auVar62,auVar62,0x94);
      auVar89._16_16_ = auVar68;
      auVar89._0_16_ = auVar72;
      auVar94._16_16_ = auVar69;
      auVar94._0_16_ = auVar68;
      auVar93 = vunpcklps_avx(auVar89,auVar94);
      auVar89 = vshufps_avx(auVar89,auVar89,0xa5);
      auVar103 = vshufps_avx(auVar94,auVar94,0x94);
      auVar28 = *(undefined1 (*) [16])pGVar55;
      if (uVar48 == 2) {
        auVar28 = vshufps_avx(auVar28,auVar28,0x54);
        auVar73 = vshufps_avx(auVar73,auVar73,0x54);
        auVar87 = vshufps_avx(auVar87,auVar87,0x54);
      }
      local_cb8 = pGVar53 + uVar52 * 0xc + lVar50 + 0x2c;
      auVar104._16_16_ = auVar73;
      auVar104._0_16_ = auVar28;
      auVar82._16_16_ = auVar87;
      auVar82._0_16_ = auVar73;
      auVar77 = vunpcklps_avx(auVar104,auVar82);
      auVar94 = vshufps_avx(auVar104,auVar104,0xa5);
      uVar1 = *(undefined4 *)(ray + k * 4);
      auVar109._4_4_ = uVar1;
      auVar109._0_4_ = uVar1;
      auVar109._8_4_ = uVar1;
      auVar109._12_4_ = uVar1;
      auVar109._16_4_ = uVar1;
      auVar109._20_4_ = uVar1;
      auVar109._24_4_ = uVar1;
      auVar109._28_4_ = uVar1;
      uVar1 = *(undefined4 *)(ray + k * 4 + 0x20);
      auVar111._4_4_ = uVar1;
      auVar111._0_4_ = uVar1;
      auVar111._8_4_ = uVar1;
      auVar111._12_4_ = uVar1;
      auVar111._16_4_ = uVar1;
      auVar111._20_4_ = uVar1;
      auVar111._24_4_ = uVar1;
      auVar111._28_4_ = uVar1;
      auVar27 = vshufps_avx(auVar82,auVar82,0x94);
      uVar1 = *(undefined4 *)(ray + k * 4 + 0x40);
      auVar114._4_4_ = uVar1;
      auVar114._0_4_ = uVar1;
      auVar114._8_4_ = uVar1;
      auVar114._12_4_ = uVar1;
      auVar114._16_4_ = uVar1;
      auVar114._20_4_ = uVar1;
      auVar114._24_4_ = uVar1;
      auVar114._28_4_ = uVar1;
      auVar71 = vsubps_avx(auVar71,auVar109);
      auVar93 = vsubps_avx(auVar93,auVar111);
      auVar77 = vsubps_avx(auVar77,auVar114);
      auVar61 = vsubps_avx(auVar61,auVar109);
      auVar89 = vsubps_avx(auVar89,auVar111);
      auVar94 = vsubps_avx(auVar94,auVar114);
      auVar62 = vsubps_avx(auVar62,auVar109);
      auVar103 = vsubps_avx(auVar103,auVar111);
      auVar27 = vsubps_avx(auVar27,auVar114);
      local_aa0 = vsubps_avx(auVar62,auVar71);
      auVar82 = vsubps_avx(auVar103,auVar93);
      local_ac0 = vsubps_avx(auVar27,auVar77);
      auVar74._0_4_ = auVar71._0_4_ + auVar62._0_4_;
      auVar74._4_4_ = auVar71._4_4_ + auVar62._4_4_;
      auVar74._8_4_ = auVar71._8_4_ + auVar62._8_4_;
      auVar74._12_4_ = auVar71._12_4_ + auVar62._12_4_;
      auVar74._16_4_ = auVar71._16_4_ + auVar62._16_4_;
      auVar74._20_4_ = auVar71._20_4_ + auVar62._20_4_;
      auVar74._24_4_ = auVar71._24_4_ + auVar62._24_4_;
      auVar74._28_4_ = auVar71._28_4_ + auVar62._28_4_;
      auVar110._0_4_ = auVar103._0_4_ + auVar93._0_4_;
      auVar110._4_4_ = auVar103._4_4_ + auVar93._4_4_;
      auVar110._8_4_ = auVar103._8_4_ + auVar93._8_4_;
      auVar110._12_4_ = auVar103._12_4_ + auVar93._12_4_;
      auVar110._16_4_ = auVar103._16_4_ + auVar93._16_4_;
      auVar110._20_4_ = auVar103._20_4_ + auVar93._20_4_;
      auVar110._24_4_ = auVar103._24_4_ + auVar93._24_4_;
      fVar10 = auVar93._28_4_;
      auVar110._28_4_ = auVar103._28_4_ + fVar10;
      fVar115 = auVar77._0_4_;
      auVar113._0_4_ = fVar115 + auVar27._0_4_;
      fVar117 = auVar77._4_4_;
      auVar113._4_4_ = fVar117 + auVar27._4_4_;
      fVar119 = auVar77._8_4_;
      auVar113._8_4_ = fVar119 + auVar27._8_4_;
      fVar121 = auVar77._12_4_;
      auVar113._12_4_ = fVar121 + auVar27._12_4_;
      fVar123 = auVar77._16_4_;
      auVar113._16_4_ = fVar123 + auVar27._16_4_;
      fVar125 = auVar77._20_4_;
      auVar113._20_4_ = fVar125 + auVar27._20_4_;
      fVar127 = auVar77._24_4_;
      auVar113._24_4_ = fVar127 + auVar27._24_4_;
      auVar113._28_4_ = auVar77._28_4_ + auVar27._28_4_;
      auVar29._4_4_ = auVar110._4_4_ * local_ac0._4_4_;
      auVar29._0_4_ = auVar110._0_4_ * local_ac0._0_4_;
      auVar29._8_4_ = auVar110._8_4_ * local_ac0._8_4_;
      auVar29._12_4_ = auVar110._12_4_ * local_ac0._12_4_;
      auVar29._16_4_ = auVar110._16_4_ * local_ac0._16_4_;
      auVar29._20_4_ = auVar110._20_4_ * local_ac0._20_4_;
      auVar29._24_4_ = auVar110._24_4_ * local_ac0._24_4_;
      auVar29._28_4_ = uVar1;
      auVar60 = vfmsub231ps_fma(auVar29,auVar82,auVar113);
      auVar30._4_4_ = auVar113._4_4_ * local_aa0._4_4_;
      auVar30._0_4_ = auVar113._0_4_ * local_aa0._0_4_;
      auVar30._8_4_ = auVar113._8_4_ * local_aa0._8_4_;
      auVar30._12_4_ = auVar113._12_4_ * local_aa0._12_4_;
      auVar30._16_4_ = auVar113._16_4_ * local_aa0._16_4_;
      auVar30._20_4_ = auVar113._20_4_ * local_aa0._20_4_;
      auVar30._24_4_ = auVar113._24_4_ * local_aa0._24_4_;
      auVar30._28_4_ = auVar113._28_4_;
      auVar28 = vfmsub231ps_fma(auVar30,local_ac0,auVar74);
      auVar31._4_4_ = auVar82._4_4_ * auVar74._4_4_;
      auVar31._0_4_ = auVar82._0_4_ * auVar74._0_4_;
      auVar31._8_4_ = auVar82._8_4_ * auVar74._8_4_;
      auVar31._12_4_ = auVar82._12_4_ * auVar74._12_4_;
      auVar31._16_4_ = auVar82._16_4_ * auVar74._16_4_;
      auVar31._20_4_ = auVar82._20_4_ * auVar74._20_4_;
      auVar31._24_4_ = auVar82._24_4_ * auVar74._24_4_;
      auVar31._28_4_ = auVar74._28_4_;
      auVar67 = vfmsub231ps_fma(auVar31,local_aa0,auVar110);
      uVar1 = *(undefined4 *)(ray + k * 4 + 0xa0);
      auVar83._4_4_ = uVar1;
      auVar83._0_4_ = uVar1;
      auVar83._8_4_ = uVar1;
      auVar83._12_4_ = uVar1;
      auVar83._16_4_ = uVar1;
      auVar83._20_4_ = uVar1;
      auVar83._24_4_ = uVar1;
      auVar83._28_4_ = uVar1;
      fVar5 = *(float *)(ray + k * 4 + 0xc0);
      auVar32._4_4_ = fVar5 * auVar67._4_4_;
      auVar32._0_4_ = fVar5 * auVar67._0_4_;
      auVar32._8_4_ = fVar5 * auVar67._8_4_;
      auVar32._12_4_ = fVar5 * auVar67._12_4_;
      auVar32._16_4_ = fVar5 * 0.0;
      auVar32._20_4_ = fVar5 * 0.0;
      auVar32._24_4_ = fVar5 * 0.0;
      auVar32._28_4_ = local_ac0._28_4_;
      auVar28 = vfmadd231ps_fma(auVar32,auVar83,ZEXT1632(auVar28));
      uVar1 = *(undefined4 *)(ray + k * 4 + 0x80);
      auVar112._4_4_ = uVar1;
      auVar112._0_4_ = uVar1;
      auVar112._8_4_ = uVar1;
      auVar112._12_4_ = uVar1;
      auVar112._16_4_ = uVar1;
      auVar112._20_4_ = uVar1;
      auVar112._24_4_ = uVar1;
      auVar112._28_4_ = uVar1;
      auVar28 = vfmadd231ps_fma(ZEXT1632(auVar28),auVar112,ZEXT1632(auVar60));
      auVar29 = vsubps_avx(auVar93,auVar89);
      local_ae0 = vsubps_avx(auVar77,auVar94);
      auVar75._0_4_ = auVar89._0_4_ + auVar93._0_4_;
      auVar75._4_4_ = auVar89._4_4_ + auVar93._4_4_;
      auVar75._8_4_ = auVar89._8_4_ + auVar93._8_4_;
      auVar75._12_4_ = auVar89._12_4_ + auVar93._12_4_;
      auVar75._16_4_ = auVar89._16_4_ + auVar93._16_4_;
      auVar75._20_4_ = auVar89._20_4_ + auVar93._20_4_;
      auVar75._24_4_ = auVar89._24_4_ + auVar93._24_4_;
      auVar75._28_4_ = auVar89._28_4_ + fVar10;
      auVar92._0_4_ = fVar115 + auVar94._0_4_;
      auVar92._4_4_ = fVar117 + auVar94._4_4_;
      auVar92._8_4_ = fVar119 + auVar94._8_4_;
      auVar92._12_4_ = fVar121 + auVar94._12_4_;
      auVar92._16_4_ = fVar123 + auVar94._16_4_;
      auVar92._20_4_ = fVar125 + auVar94._20_4_;
      auVar92._24_4_ = fVar127 + auVar94._24_4_;
      fVar90 = auVar94._28_4_;
      auVar92._28_4_ = auVar77._28_4_ + fVar90;
      fVar11 = local_ae0._0_4_;
      fVar12 = local_ae0._4_4_;
      auVar33._4_4_ = auVar75._4_4_ * fVar12;
      auVar33._0_4_ = auVar75._0_4_ * fVar11;
      fVar14 = local_ae0._8_4_;
      auVar33._8_4_ = auVar75._8_4_ * fVar14;
      fVar16 = local_ae0._12_4_;
      auVar33._12_4_ = auVar75._12_4_ * fVar16;
      fVar18 = local_ae0._16_4_;
      auVar33._16_4_ = auVar75._16_4_ * fVar18;
      fVar20 = local_ae0._20_4_;
      auVar33._20_4_ = auVar75._20_4_ * fVar20;
      fVar22 = local_ae0._24_4_;
      auVar33._24_4_ = auVar75._24_4_ * fVar22;
      auVar33._28_4_ = fVar10;
      auVar67 = vfmsub231ps_fma(auVar33,auVar29,auVar92);
      auVar30 = vsubps_avx(auVar71,auVar61);
      fVar116 = auVar30._0_4_;
      fVar118 = auVar30._4_4_;
      auVar34._4_4_ = fVar118 * auVar92._4_4_;
      auVar34._0_4_ = fVar116 * auVar92._0_4_;
      fVar120 = auVar30._8_4_;
      auVar34._8_4_ = fVar120 * auVar92._8_4_;
      fVar122 = auVar30._12_4_;
      auVar34._12_4_ = fVar122 * auVar92._12_4_;
      fVar124 = auVar30._16_4_;
      auVar34._16_4_ = fVar124 * auVar92._16_4_;
      fVar126 = auVar30._20_4_;
      auVar34._20_4_ = fVar126 * auVar92._20_4_;
      fVar128 = auVar30._24_4_;
      auVar34._24_4_ = fVar128 * auVar92._24_4_;
      auVar34._28_4_ = auVar92._28_4_;
      auVar105._0_4_ = auVar71._0_4_ + auVar61._0_4_;
      auVar105._4_4_ = auVar71._4_4_ + auVar61._4_4_;
      auVar105._8_4_ = auVar71._8_4_ + auVar61._8_4_;
      auVar105._12_4_ = auVar71._12_4_ + auVar61._12_4_;
      auVar105._16_4_ = auVar71._16_4_ + auVar61._16_4_;
      auVar105._20_4_ = auVar71._20_4_ + auVar61._20_4_;
      auVar105._24_4_ = auVar71._24_4_ + auVar61._24_4_;
      auVar105._28_4_ = auVar71._28_4_ + auVar61._28_4_;
      auVar60 = vfmsub231ps_fma(auVar34,local_ae0,auVar105);
      fVar10 = auVar29._0_4_;
      fVar13 = auVar29._4_4_;
      auVar35._4_4_ = auVar105._4_4_ * fVar13;
      auVar35._0_4_ = auVar105._0_4_ * fVar10;
      fVar15 = auVar29._8_4_;
      auVar35._8_4_ = auVar105._8_4_ * fVar15;
      fVar17 = auVar29._12_4_;
      auVar35._12_4_ = auVar105._12_4_ * fVar17;
      fVar19 = auVar29._16_4_;
      auVar35._16_4_ = auVar105._16_4_ * fVar19;
      fVar21 = auVar29._20_4_;
      auVar35._20_4_ = auVar105._20_4_ * fVar21;
      fVar23 = auVar29._24_4_;
      auVar35._24_4_ = auVar105._24_4_ * fVar23;
      auVar35._28_4_ = auVar105._28_4_;
      auVar68 = vfmsub231ps_fma(auVar35,auVar30,auVar75);
      auVar106._0_4_ = auVar68._0_4_ * fVar5;
      auVar106._4_4_ = auVar68._4_4_ * fVar5;
      auVar106._8_4_ = auVar68._8_4_ * fVar5;
      auVar106._12_4_ = auVar68._12_4_ * fVar5;
      auVar106._16_4_ = fVar5 * 0.0;
      auVar106._20_4_ = fVar5 * 0.0;
      auVar106._24_4_ = fVar5 * 0.0;
      auVar106._28_4_ = 0;
      auVar60 = vfmadd231ps_fma(auVar106,auVar83,ZEXT1632(auVar60));
      auVar60 = vfmadd231ps_fma(ZEXT1632(auVar60),auVar112,ZEXT1632(auVar67));
      auVar31 = vsubps_avx(auVar61,auVar62);
      auVar79._0_4_ = auVar61._0_4_ + auVar62._0_4_;
      auVar79._4_4_ = auVar61._4_4_ + auVar62._4_4_;
      auVar79._8_4_ = auVar61._8_4_ + auVar62._8_4_;
      auVar79._12_4_ = auVar61._12_4_ + auVar62._12_4_;
      auVar79._16_4_ = auVar61._16_4_ + auVar62._16_4_;
      auVar79._20_4_ = auVar61._20_4_ + auVar62._20_4_;
      auVar79._24_4_ = auVar61._24_4_ + auVar62._24_4_;
      auVar79._28_4_ = auVar61._28_4_ + auVar62._28_4_;
      auVar32 = vsubps_avx(auVar89,auVar103);
      auVar70._0_4_ = auVar89._0_4_ + auVar103._0_4_;
      auVar70._4_4_ = auVar89._4_4_ + auVar103._4_4_;
      auVar70._8_4_ = auVar89._8_4_ + auVar103._8_4_;
      auVar70._12_4_ = auVar89._12_4_ + auVar103._12_4_;
      auVar70._16_4_ = auVar89._16_4_ + auVar103._16_4_;
      auVar70._20_4_ = auVar89._20_4_ + auVar103._20_4_;
      auVar70._24_4_ = auVar89._24_4_ + auVar103._24_4_;
      auVar70._28_4_ = auVar89._28_4_ + auVar103._28_4_;
      auVar103 = vsubps_avx(auVar94,auVar27);
      auVar63._0_4_ = auVar94._0_4_ + auVar27._0_4_;
      auVar63._4_4_ = auVar94._4_4_ + auVar27._4_4_;
      auVar63._8_4_ = auVar94._8_4_ + auVar27._8_4_;
      auVar63._12_4_ = auVar94._12_4_ + auVar27._12_4_;
      auVar63._16_4_ = auVar94._16_4_ + auVar27._16_4_;
      auVar63._20_4_ = auVar94._20_4_ + auVar27._20_4_;
      auVar63._24_4_ = auVar94._24_4_ + auVar27._24_4_;
      auVar63._28_4_ = fVar90 + auVar27._28_4_;
      auVar27._4_4_ = auVar70._4_4_ * auVar103._4_4_;
      auVar27._0_4_ = auVar70._0_4_ * auVar103._0_4_;
      auVar27._8_4_ = auVar70._8_4_ * auVar103._8_4_;
      auVar27._12_4_ = auVar70._12_4_ * auVar103._12_4_;
      auVar27._16_4_ = auVar70._16_4_ * auVar103._16_4_;
      auVar27._20_4_ = auVar70._20_4_ * auVar103._20_4_;
      auVar27._24_4_ = auVar70._24_4_ * auVar103._24_4_;
      auVar27._28_4_ = fVar90;
      auVar68 = vfmsub231ps_fma(auVar27,auVar32,auVar63);
      auVar36._4_4_ = auVar63._4_4_ * auVar31._4_4_;
      auVar36._0_4_ = auVar63._0_4_ * auVar31._0_4_;
      auVar36._8_4_ = auVar63._8_4_ * auVar31._8_4_;
      auVar36._12_4_ = auVar63._12_4_ * auVar31._12_4_;
      auVar36._16_4_ = auVar63._16_4_ * auVar31._16_4_;
      auVar36._20_4_ = auVar63._20_4_ * auVar31._20_4_;
      auVar36._24_4_ = auVar63._24_4_ * auVar31._24_4_;
      auVar36._28_4_ = auVar63._28_4_;
      auVar67 = vfmsub231ps_fma(auVar36,auVar103,auVar79);
      auVar37._4_4_ = auVar32._4_4_ * auVar79._4_4_;
      auVar37._0_4_ = auVar32._0_4_ * auVar79._0_4_;
      auVar37._8_4_ = auVar32._8_4_ * auVar79._8_4_;
      auVar37._12_4_ = auVar32._12_4_ * auVar79._12_4_;
      auVar37._16_4_ = auVar32._16_4_ * auVar79._16_4_;
      auVar37._20_4_ = auVar32._20_4_ * auVar79._20_4_;
      auVar37._24_4_ = auVar32._24_4_ * auVar79._24_4_;
      auVar37._28_4_ = auVar79._28_4_;
      auVar69 = vfmsub231ps_fma(auVar37,auVar31,auVar70);
      auVar38._4_4_ = fVar5 * auVar69._4_4_;
      auVar38._0_4_ = fVar5 * auVar69._0_4_;
      auVar38._8_4_ = fVar5 * auVar69._8_4_;
      auVar38._12_4_ = fVar5 * auVar69._12_4_;
      auVar38._16_4_ = fVar5 * 0.0;
      auVar38._20_4_ = fVar5 * 0.0;
      auVar38._24_4_ = fVar5 * 0.0;
      auVar38._28_4_ = auVar70._28_4_;
      auVar67 = vfmadd231ps_fma(auVar38,auVar83,ZEXT1632(auVar67));
      auVar67 = vfmadd231ps_fma(ZEXT1632(auVar67),auVar112,ZEXT1632(auVar68));
      local_a60 = auVar60._0_4_;
      fStack_a5c = auVar60._4_4_;
      fStack_a58 = auVar60._8_4_;
      fStack_a54 = auVar60._12_4_;
      local_b60 = ZEXT1632(CONCAT412(auVar67._12_4_ + auVar28._12_4_ + fStack_a54,
                                     CONCAT48(auVar67._8_4_ + auVar28._8_4_ + fStack_a58,
                                              CONCAT44(auVar67._4_4_ + auVar28._4_4_ + fStack_a5c,
                                                       auVar67._0_4_ + auVar28._0_4_ + local_a60))))
      ;
      auVar64._8_4_ = 0x7fffffff;
      auVar64._0_8_ = 0x7fffffff7fffffff;
      auVar64._12_4_ = 0x7fffffff;
      auVar64._16_4_ = 0x7fffffff;
      auVar64._20_4_ = 0x7fffffff;
      auVar64._24_4_ = 0x7fffffff;
      auVar64._28_4_ = 0x7fffffff;
      auVar61 = vminps_avx(ZEXT1632(auVar28),ZEXT1632(auVar60));
      auVar61 = vminps_avx(auVar61,ZEXT1632(auVar67));
      local_b20 = vandps_avx(local_b60,auVar64);
      fVar90 = local_b20._0_4_ * 1.1920929e-07;
      fVar96 = local_b20._4_4_ * 1.1920929e-07;
      auVar39._4_4_ = fVar96;
      auVar39._0_4_ = fVar90;
      fVar97 = local_b20._8_4_ * 1.1920929e-07;
      auVar39._8_4_ = fVar97;
      fVar98 = local_b20._12_4_ * 1.1920929e-07;
      auVar39._12_4_ = fVar98;
      fVar99 = local_b20._16_4_ * 1.1920929e-07;
      auVar39._16_4_ = fVar99;
      fVar100 = local_b20._20_4_ * 1.1920929e-07;
      auVar39._20_4_ = fVar100;
      fVar101 = local_b20._24_4_ * 1.1920929e-07;
      auVar39._24_4_ = fVar101;
      auVar39._28_4_ = 0x34000000;
      auVar80._0_8_ = CONCAT44(fVar96,fVar90) ^ 0x8000000080000000;
      auVar80._8_4_ = -fVar97;
      auVar80._12_4_ = -fVar98;
      auVar80._16_4_ = -fVar99;
      auVar80._20_4_ = -fVar100;
      auVar80._24_4_ = -fVar101;
      auVar80._28_4_ = 0xb4000000;
      auVar61 = vcmpps_avx(auVar61,auVar80,5);
      local_be0 = ZEXT1632(auVar60);
      auVar89 = vmaxps_avx(ZEXT1632(auVar28),local_be0);
      auVar62 = vmaxps_avx(auVar89,ZEXT1632(auVar67));
      auVar62 = vcmpps_avx(auVar62,auVar39,2);
      auVar62 = vorps_avx(auVar61,auVar62);
      if ((((((((auVar62 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
               (auVar62 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
              (auVar62 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
             SUB321(auVar62 >> 0x7f,0) != '\0') ||
            (auVar62 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
           SUB321(auVar62 >> 0xbf,0) != '\0') ||
          (auVar62 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
          auVar62[0x1f] < '\0') {
        auVar40._4_4_ = fVar13 * local_ac0._4_4_;
        auVar40._0_4_ = fVar10 * local_ac0._0_4_;
        auVar40._8_4_ = fVar15 * local_ac0._8_4_;
        auVar40._12_4_ = fVar17 * local_ac0._12_4_;
        auVar40._16_4_ = fVar19 * local_ac0._16_4_;
        auVar40._20_4_ = fVar21 * local_ac0._20_4_;
        auVar40._24_4_ = fVar23 * local_ac0._24_4_;
        auVar40._28_4_ = auVar61._28_4_;
        auVar41._4_4_ = fVar118 * auVar82._4_4_;
        auVar41._0_4_ = fVar116 * auVar82._0_4_;
        auVar41._8_4_ = fVar120 * auVar82._8_4_;
        auVar41._12_4_ = fVar122 * auVar82._12_4_;
        auVar41._16_4_ = fVar124 * auVar82._16_4_;
        auVar41._20_4_ = fVar126 * auVar82._20_4_;
        auVar41._24_4_ = fVar128 * auVar82._24_4_;
        auVar41._28_4_ = auVar89._28_4_;
        auVar60 = vfmsub213ps_fma(auVar82,local_ae0,auVar40);
        auVar42._4_4_ = auVar32._4_4_ * fVar12;
        auVar42._0_4_ = auVar32._0_4_ * fVar11;
        auVar42._8_4_ = auVar32._8_4_ * fVar14;
        auVar42._12_4_ = auVar32._12_4_ * fVar16;
        auVar42._16_4_ = auVar32._16_4_ * fVar18;
        auVar42._20_4_ = auVar32._20_4_ * fVar20;
        auVar42._24_4_ = auVar32._24_4_ * fVar22;
        auVar42._28_4_ = 0x34000000;
        auVar107._0_4_ = fVar116 * auVar103._0_4_;
        auVar107._4_4_ = fVar118 * auVar103._4_4_;
        auVar107._8_4_ = fVar120 * auVar103._8_4_;
        auVar107._12_4_ = fVar122 * auVar103._12_4_;
        auVar107._16_4_ = fVar124 * auVar103._16_4_;
        auVar107._20_4_ = fVar126 * auVar103._20_4_;
        auVar107._24_4_ = fVar128 * auVar103._24_4_;
        auVar107._28_4_ = 0;
        auVar67 = vfmsub213ps_fma(auVar103,auVar29,auVar42);
        auVar61 = vandps_avx(auVar40,auVar64);
        auVar89 = vandps_avx(auVar42,auVar64);
        auVar61 = vcmpps_avx(auVar61,auVar89,1);
        local_b00 = vblendvps_avx(ZEXT1632(auVar67),ZEXT1632(auVar60),auVar61);
        auVar43._4_4_ = fVar13 * auVar31._4_4_;
        auVar43._0_4_ = fVar10 * auVar31._0_4_;
        auVar43._8_4_ = fVar15 * auVar31._8_4_;
        auVar43._12_4_ = fVar17 * auVar31._12_4_;
        auVar43._16_4_ = fVar19 * auVar31._16_4_;
        auVar43._20_4_ = fVar21 * auVar31._20_4_;
        auVar43._24_4_ = fVar23 * auVar31._24_4_;
        auVar43._28_4_ = local_b00._28_4_;
        auVar60 = vfmsub213ps_fma(auVar31,local_ae0,auVar107);
        auVar88._0_4_ = local_aa0._0_4_ * fVar11;
        auVar88._4_4_ = local_aa0._4_4_ * fVar12;
        auVar88._8_4_ = local_aa0._8_4_ * fVar14;
        auVar88._12_4_ = local_aa0._12_4_ * fVar16;
        auVar88._16_4_ = local_aa0._16_4_ * fVar18;
        auVar88._20_4_ = local_aa0._20_4_ * fVar20;
        auVar88._24_4_ = local_aa0._24_4_ * fVar22;
        auVar88._28_4_ = 0;
        auVar67 = vfmsub213ps_fma(local_ac0,auVar30,auVar88);
        auVar61 = vandps_avx(auVar88,auVar64);
        auVar89 = vandps_avx(auVar107,auVar64);
        auVar61 = vcmpps_avx(auVar61,auVar89,1);
        local_960 = vblendvps_avx(ZEXT1632(auVar60),ZEXT1632(auVar67),auVar61);
        auVar60 = vfmsub213ps_fma(local_aa0,auVar29,auVar41);
        auVar67 = vfmsub213ps_fma(auVar32,auVar30,auVar43);
        auVar61 = vandps_avx(auVar41,auVar64);
        auVar89 = vandps_avx(auVar43,auVar64);
        auVar61 = vcmpps_avx(auVar61,auVar89,1);
        local_940 = vblendvps_avx(ZEXT1632(auVar67),ZEXT1632(auVar60),auVar61);
        auVar60 = vpackssdw_avx(auVar62._0_16_,auVar62._16_16_);
        auVar65._0_4_ = local_940._0_4_ * fVar5;
        auVar65._4_4_ = local_940._4_4_ * fVar5;
        auVar65._8_4_ = local_940._8_4_ * fVar5;
        auVar65._12_4_ = local_940._12_4_ * fVar5;
        auVar65._16_4_ = local_940._16_4_ * fVar5;
        auVar65._20_4_ = local_940._20_4_ * fVar5;
        auVar65._24_4_ = local_940._24_4_ * fVar5;
        auVar65._28_4_ = 0;
        auVar67 = vfmadd213ps_fma(auVar83,local_960,auVar65);
        auVar67 = vfmadd213ps_fma(auVar112,local_b00,ZEXT1632(auVar67));
        auVar89 = ZEXT1632(CONCAT412(auVar67._12_4_ + auVar67._12_4_,
                                     CONCAT48(auVar67._8_4_ + auVar67._8_4_,
                                              CONCAT44(auVar67._4_4_ + auVar67._4_4_,
                                                       auVar67._0_4_ + auVar67._0_4_))));
        auVar44._4_4_ = local_940._4_4_ * fVar117;
        auVar44._0_4_ = local_940._0_4_ * fVar115;
        auVar44._8_4_ = local_940._8_4_ * fVar119;
        auVar44._12_4_ = local_940._12_4_ * fVar121;
        auVar44._16_4_ = local_940._16_4_ * fVar123;
        auVar44._20_4_ = local_940._20_4_ * fVar125;
        auVar44._24_4_ = local_940._24_4_ * fVar127;
        auVar44._28_4_ = 0;
        auVar67 = vfmadd213ps_fma(auVar93,local_960,auVar44);
        auVar68 = vfmadd213ps_fma(auVar71,local_b00,ZEXT1632(auVar67));
        auVar61 = vrcpps_avx(auVar89);
        auVar93._8_4_ = 0x3f800000;
        auVar93._0_8_ = 0x3f8000003f800000;
        auVar93._12_4_ = 0x3f800000;
        auVar93._16_4_ = 0x3f800000;
        auVar93._20_4_ = 0x3f800000;
        auVar93._24_4_ = 0x3f800000;
        auVar93._28_4_ = 0x3f800000;
        auVar67 = vfnmadd213ps_fma(auVar61,auVar89,auVar93);
        auVar67 = vfmadd132ps_fma(ZEXT1632(auVar67),auVar61,auVar61);
        local_9a0 = ZEXT1632(CONCAT412((auVar68._12_4_ + auVar68._12_4_) * auVar67._12_4_,
                                       CONCAT48((auVar68._8_4_ + auVar68._8_4_) * auVar67._8_4_,
                                                CONCAT44((auVar68._4_4_ + auVar68._4_4_) *
                                                         auVar67._4_4_,
                                                         (auVar68._0_4_ + auVar68._0_4_) *
                                                         auVar67._0_4_))));
        uVar1 = *(undefined4 *)(ray + k * 4 + 0x60);
        auVar71._4_4_ = uVar1;
        auVar71._0_4_ = uVar1;
        auVar71._8_4_ = uVar1;
        auVar71._12_4_ = uVar1;
        auVar71._16_4_ = uVar1;
        auVar71._20_4_ = uVar1;
        auVar71._24_4_ = uVar1;
        auVar71._28_4_ = uVar1;
        uVar1 = *(undefined4 *)(ray + k * 4 + 0x100);
        local_bc0._4_4_ = uVar1;
        local_bc0._0_4_ = uVar1;
        local_bc0._8_4_ = uVar1;
        local_bc0._12_4_ = uVar1;
        local_bc0._16_4_ = uVar1;
        local_bc0._20_4_ = uVar1;
        local_bc0._24_4_ = uVar1;
        local_bc0._28_4_ = uVar1;
        auVar61 = vcmpps_avx(auVar71,local_9a0,2);
        auVar62 = vcmpps_avx(local_9a0,local_bc0,2);
        auVar61 = vandps_avx(auVar61,auVar62);
        auVar67 = vpackssdw_avx(auVar61._0_16_,auVar61._16_16_);
        auVar60 = vpand_avx(auVar67,auVar60);
        auVar61 = vpmovsxwd_avx2(auVar60);
        if ((((((((auVar61 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
                 (auVar61 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                (auVar61 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
               SUB321(auVar61 >> 0x7f,0) != '\0') ||
              (auVar61 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
             SUB321(auVar61 >> 0xbf,0) != '\0') ||
            (auVar61 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
            auVar61[0x1f] < '\0') {
          auVar61 = vcmpps_avx(auVar89,_DAT_01f7b000,4);
          auVar67 = vpackssdw_avx(auVar61._0_16_,auVar61._16_16_);
          auVar60 = vpand_avx(auVar60,auVar67);
          local_a00 = vpmovsxwd_avx2(auVar60);
          if ((((((((local_a00 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
                   (local_a00 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                  (local_a00 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                 SUB321(local_a00 >> 0x7f,0) != '\0') ||
                (local_a00 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
               SUB321(local_a00 >> 0xbf,0) != '\0') ||
              (local_a00 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
              local_a00[0x1f] < '\0') {
            uStack_c50._0_4_ = *(uint *)(pGVar53 + 0x18);
            uVar1 = *(undefined4 *)(pGVar53 + 0x1c);
            local_c60 = auVar28._0_8_;
            uStack_c58 = auVar28._8_8_;
            local_a80 = local_c60;
            uStack_a78 = uStack_c58;
            uStack_a70 = 0;
            uStack_a68 = 0;
            uStack_a50 = 0;
            uStack_a4c = 0;
            uStack_a48 = 0;
            uStack_a44 = 0;
            local_a20 = &local_cb8;
            local_980 = local_b00;
            pGVar56 = (context->scene->geometries).items[(uint)uStack_c50].ptr;
            if ((pGVar56->mask & *(uint *)(ray + k * 4 + 0x120)) != 0) {
              if ((context->args->filter == (RTCFilterFunctionN)0x0) &&
                 (pGVar56->occlusionFilterN == (RTCFilterFunctionN)0x0)) {
LAB_01619c75:
                *(undefined4 *)(ray + k * 4 + 0x100) = 0xff800000;
                goto LAB_01619c81;
              }
              auVar67 = *(undefined1 (*) [16])(local_cb8 + local_cb0 * 4);
              auVar68 = auVar67;
              if (2 < local_ca8) {
                auVar68 = *(undefined1 (*) [16])(local_cb8 + local_cb0 * 8);
              }
              auVar61 = vrcpps_avx(local_b60);
              auVar84._8_4_ = 0x3f800000;
              auVar84._0_8_ = 0x3f8000003f800000;
              auVar84._12_4_ = 0x3f800000;
              auVar84._16_4_ = 0x3f800000;
              auVar84._20_4_ = 0x3f800000;
              auVar84._24_4_ = 0x3f800000;
              auVar84._28_4_ = 0x3f800000;
              auVar69 = vfnmadd213ps_fma(local_b60,auVar61,auVar84);
              auVar69 = vfmadd132ps_fma(ZEXT1632(auVar69),auVar61,auVar61);
              auVar66._8_4_ = 0x219392ef;
              auVar66._0_8_ = 0x219392ef219392ef;
              auVar66._12_4_ = 0x219392ef;
              auVar66._16_4_ = 0x219392ef;
              auVar66._20_4_ = 0x219392ef;
              auVar66._24_4_ = 0x219392ef;
              auVar66._28_4_ = 0x219392ef;
              auVar62 = vcmpps_avx(local_b20,auVar66,5);
              auVar61 = vandps_avx(auVar62,ZEXT1632(auVar69));
              auVar45._4_4_ = auVar61._4_4_ * auVar28._4_4_;
              auVar45._0_4_ = auVar61._0_4_ * auVar28._0_4_;
              auVar45._8_4_ = auVar61._8_4_ * auVar28._8_4_;
              auVar45._12_4_ = auVar61._12_4_ * auVar28._12_4_;
              auVar45._16_4_ = auVar61._16_4_ * 0.0;
              auVar45._20_4_ = auVar61._20_4_ * 0.0;
              auVar45._24_4_ = auVar61._24_4_ * 0.0;
              auVar45._28_4_ = auVar62._28_4_;
              local_ca0 = vminps_avx(auVar45,auVar84);
              auVar46._4_4_ = fStack_a5c * auVar61._4_4_;
              auVar46._0_4_ = local_a60 * auVar61._0_4_;
              auVar46._8_4_ = fStack_a58 * auVar61._8_4_;
              auVar46._12_4_ = fStack_a54 * auVar61._12_4_;
              auVar46._16_4_ = auVar61._16_4_ * 0.0;
              auVar46._20_4_ = auVar61._20_4_ * 0.0;
              auVar46._24_4_ = auVar61._24_4_ * 0.0;
              auVar46._28_4_ = auVar61._28_4_;
              auVar61 = vminps_avx(auVar46,auVar84);
              auVar28 = *(undefined1 (*) [16])local_cb8;
              if (local_cb0 == 2) {
                auVar28 = vpshufd_avx(auVar28,0x54);
                auVar67 = vpshufd_avx(auVar67,0x54);
                auVar68 = vpshufd_avx(auVar68,0x54);
              }
              auVar85._0_16_ = ZEXT116(0) * auVar67 + ZEXT116(1) * auVar28;
              auVar85._16_16_ = ZEXT116(1) * auVar67;
              auVar76._0_16_ = ZEXT116(0) * auVar68 + ZEXT116(1) * auVar67;
              auVar76._16_16_ = ZEXT116(0) * SUB4816((undefined1  [48])0x0,0) + ZEXT116(1) * auVar68
              ;
              auVar62 = vpunpckldq_avx2(auVar85,auVar76);
              auVar103 = vpshufd_avx2(auVar85,0xa5);
              auVar93 = vpshufd_avx2(auVar76,0x94);
              auVar89 = vpsrld_avx2(auVar62,0x10);
              auVar71 = ZEXT1232(ZEXT412(0)) << 0x20;
              auVar62 = vpblendw_avx2(auVar62,auVar71,0xaa);
              auVar62 = vcvtdq2ps_avx(auVar62);
              auVar89 = vcvtdq2ps_avx(auVar89);
              auVar94 = vpsrld_avx2(auVar103,0x10);
              auVar103 = vpblendw_avx2(auVar103,auVar71,0xaa);
              auVar103 = vcvtdq2ps_avx(auVar103);
              auVar71 = vcvtdq2ps_avx(auVar94);
              auVar94 = vpsrld_avx2(auVar93,0x10);
              auVar93 = vpblendw_avx2(auVar93,ZEXT1232(ZEXT412(0)) << 0x20,0xaa);
              auVar93 = vcvtdq2ps_avx(auVar93);
              auVar94 = vcvtdq2ps_avx(auVar94);
              auVar95._8_4_ = 0x3f800000;
              auVar95._0_8_ = 0x3f8000003f800000;
              auVar95._12_4_ = 0x3f800000;
              auVar95._16_4_ = 0x3f800000;
              auVar95._20_4_ = 0x3f800000;
              auVar95._24_4_ = 0x3f800000;
              auVar95._28_4_ = 0x3f800000;
              auVar27 = vsubps_avx(auVar95,local_ca0);
              auVar27 = vsubps_avx(auVar27,auVar61);
              local_9e0._0_4_ =
                   auVar61._0_4_ * auVar93._0_4_ * 0.00012207031 +
                   local_ca0._0_4_ * auVar103._0_4_ * 0.00012207031 +
                   auVar27._0_4_ * auVar62._0_4_ * 0.00012207031;
              local_9e0._4_4_ =
                   auVar61._4_4_ * auVar93._4_4_ * 0.00012207031 +
                   local_ca0._4_4_ * auVar103._4_4_ * 0.00012207031 +
                   auVar27._4_4_ * auVar62._4_4_ * 0.00012207031;
              local_9e0._8_4_ =
                   auVar61._8_4_ * auVar93._8_4_ * 0.00012207031 +
                   local_ca0._8_4_ * auVar103._8_4_ * 0.00012207031 +
                   auVar27._8_4_ * auVar62._8_4_ * 0.00012207031;
              local_9e0._12_4_ =
                   auVar61._12_4_ * auVar93._12_4_ * 0.00012207031 +
                   local_ca0._12_4_ * auVar103._12_4_ * 0.00012207031 +
                   auVar27._12_4_ * auVar62._12_4_ * 0.00012207031;
              local_9e0._16_4_ =
                   auVar61._16_4_ * auVar93._16_4_ * 0.00012207031 +
                   local_ca0._16_4_ * auVar103._16_4_ * 0.00012207031 +
                   auVar27._16_4_ * auVar62._16_4_ * 0.00012207031;
              local_9e0._20_4_ =
                   auVar61._20_4_ * auVar93._20_4_ * 0.00012207031 +
                   local_ca0._20_4_ * auVar103._20_4_ * 0.00012207031 +
                   auVar27._20_4_ * auVar62._20_4_ * 0.00012207031;
              local_9e0._24_4_ =
                   auVar61._24_4_ * auVar93._24_4_ * 0.00012207031 +
                   local_ca0._24_4_ * auVar103._24_4_ * 0.00012207031 +
                   auVar27._24_4_ * auVar62._24_4_ * 0.00012207031;
              local_9e0._28_4_ = auVar93._28_4_ + auVar103._28_4_ + auVar61._28_4_;
              local_9c0[0] = auVar94._0_4_ * 0.00012207031 * auVar61._0_4_ +
                             local_ca0._0_4_ * auVar71._0_4_ * 0.00012207031 +
                             auVar27._0_4_ * auVar89._0_4_ * 0.00012207031;
              local_9c0[1] = auVar94._4_4_ * 0.00012207031 * auVar61._4_4_ +
                             local_ca0._4_4_ * auVar71._4_4_ * 0.00012207031 +
                             auVar27._4_4_ * auVar89._4_4_ * 0.00012207031;
              local_9c0[2] = auVar94._8_4_ * 0.00012207031 * auVar61._8_4_ +
                             local_ca0._8_4_ * auVar71._8_4_ * 0.00012207031 +
                             auVar27._8_4_ * auVar89._8_4_ * 0.00012207031;
              local_9c0[3] = auVar94._12_4_ * 0.00012207031 * auVar61._12_4_ +
                             local_ca0._12_4_ * auVar71._12_4_ * 0.00012207031 +
                             auVar27._12_4_ * auVar89._12_4_ * 0.00012207031;
              fStack_9b0 = auVar94._16_4_ * 0.00012207031 * auVar61._16_4_ +
                           local_ca0._16_4_ * auVar71._16_4_ * 0.00012207031 +
                           auVar27._16_4_ * auVar89._16_4_ * 0.00012207031;
              fStack_9ac = auVar94._20_4_ * 0.00012207031 * auVar61._20_4_ +
                           local_ca0._20_4_ * auVar71._20_4_ * 0.00012207031 +
                           auVar27._20_4_ * auVar89._20_4_ * 0.00012207031;
              fStack_9a8 = auVar94._24_4_ * 0.00012207031 * auVar61._24_4_ +
                           local_ca0._24_4_ * auVar71._24_4_ * 0.00012207031 +
                           auVar27._24_4_ * auVar89._24_4_ * 0.00012207031;
              fStack_9a4 = auVar103._28_4_ + auVar71._28_4_ + auVar27._28_4_;
              auVar28 = vpacksswb_avx(auVar60,auVar60);
              lVar50 = 0;
              uVar49 = (ulong)(byte)(SUB161(auVar28 >> 7,0) & 1 |
                                     (SUB161(auVar28 >> 0xf,0) & 1) << 1 |
                                     (SUB161(auVar28 >> 0x17,0) & 1) << 2 |
                                     (SUB161(auVar28 >> 0x1f,0) & 1) << 3 |
                                     (SUB161(auVar28 >> 0x27,0) & 1) << 4 |
                                     (SUB161(auVar28 >> 0x2f,0) & 1) << 5 |
                                     (SUB161(auVar28 >> 0x37,0) & 1) << 6 |
                                    SUB161(auVar28 >> 0x3f,0) << 7);
              for (uVar52 = uVar49; (uVar52 & 1) == 0; uVar52 = uVar52 >> 1 | 0x8000000000000000) {
                lVar50 = lVar50 + 1;
              }
              local_c60._4_4_ = (uint)uStack_c50;
              local_c60._0_4_ = (uint)uStack_c50;
              uStack_c58._0_4_ = (uint)uStack_c50;
              uStack_c58._4_4_ = (uint)uStack_c50;
              uStack_c50._4_4_ = (uint)uStack_c50;
              uStack_c48._0_4_ = (uint)uStack_c50;
              uStack_c48._4_4_ = (uint)uStack_c50;
              local_ba0._4_4_ = uVar1;
              local_ba0._0_4_ = uVar1;
              local_ba0._8_4_ = uVar1;
              local_ba0._12_4_ = uVar1;
              local_ba0._16_4_ = uVar1;
              local_ba0._20_4_ = uVar1;
              local_ba0._24_4_ = uVar1;
              local_ba0._28_4_ = uVar1;
              auStack_bf8 = auVar77._8_24_;
              local_c00 = pGVar56;
              local_a40 = local_b60;
              while (uVar49 != 0) {
                local_8c0 = local_9c0[lVar50 + -8];
                local_8a0 = local_9c0[lVar50];
                *(undefined4 *)(ray + k * 4 + 0x100) = *(undefined4 *)(local_9a0 + lVar50 * 4);
                uVar1 = *(undefined4 *)(local_980 + lVar50 * 4);
                auVar77._4_4_ = uVar1;
                auVar77._0_4_ = uVar1;
                auVar77._8_4_ = uVar1;
                auVar77._12_4_ = uVar1;
                auVar77._16_4_ = uVar1;
                auVar77._20_4_ = uVar1;
                auVar77._24_4_ = uVar1;
                auVar77._28_4_ = uVar1;
                uVar6 = *(undefined4 *)(local_960 + lVar50 * 4);
                local_900._4_4_ = uVar6;
                local_900._0_4_ = uVar6;
                local_900._8_4_ = uVar6;
                local_900._12_4_ = uVar6;
                local_900._16_4_ = uVar6;
                local_900._20_4_ = uVar6;
                local_900._24_4_ = uVar6;
                local_900._28_4_ = uVar6;
                local_ca0._0_8_ = lVar50;
                uVar6 = *(undefined4 *)(local_940 + lVar50 * 4);
                local_8e0._4_4_ = uVar6;
                local_8e0._0_4_ = uVar6;
                local_8e0._8_4_ = uVar6;
                local_8e0._12_4_ = uVar6;
                local_8e0._16_4_ = uVar6;
                local_8e0._20_4_ = uVar6;
                local_8e0._24_4_ = uVar6;
                local_8e0._28_4_ = uVar6;
                local_c30.context = context->user;
                local_920[0] = (RTCHitN)(char)uVar1;
                local_920[1] = (RTCHitN)(char)((uint)uVar1 >> 8);
                local_920[2] = (RTCHitN)(char)((uint)uVar1 >> 0x10);
                local_920[3] = (RTCHitN)(char)((uint)uVar1 >> 0x18);
                local_920[4] = (RTCHitN)(char)uVar1;
                local_920[5] = (RTCHitN)(char)((uint)uVar1 >> 8);
                local_920[6] = (RTCHitN)(char)((uint)uVar1 >> 0x10);
                local_920[7] = (RTCHitN)(char)((uint)uVar1 >> 0x18);
                local_920[8] = (RTCHitN)(char)uVar1;
                local_920[9] = (RTCHitN)(char)((uint)uVar1 >> 8);
                local_920[10] = (RTCHitN)(char)((uint)uVar1 >> 0x10);
                local_920[0xb] = (RTCHitN)(char)((uint)uVar1 >> 0x18);
                local_920[0xc] = (RTCHitN)(char)uVar1;
                local_920[0xd] = (RTCHitN)(char)((uint)uVar1 >> 8);
                local_920[0xe] = (RTCHitN)(char)((uint)uVar1 >> 0x10);
                local_920[0xf] = (RTCHitN)(char)((uint)uVar1 >> 0x18);
                local_920[0x10] = (RTCHitN)(char)uVar1;
                local_920[0x11] = (RTCHitN)(char)((uint)uVar1 >> 8);
                local_920[0x12] = (RTCHitN)(char)((uint)uVar1 >> 0x10);
                local_920[0x13] = (RTCHitN)(char)((uint)uVar1 >> 0x18);
                local_920[0x14] = (RTCHitN)(char)uVar1;
                local_920[0x15] = (RTCHitN)(char)((uint)uVar1 >> 8);
                local_920[0x16] = (RTCHitN)(char)((uint)uVar1 >> 0x10);
                local_920[0x17] = (RTCHitN)(char)((uint)uVar1 >> 0x18);
                local_920[0x18] = (RTCHitN)(char)uVar1;
                local_920[0x19] = (RTCHitN)(char)((uint)uVar1 >> 8);
                local_920[0x1a] = (RTCHitN)(char)((uint)uVar1 >> 0x10);
                local_920[0x1b] = (RTCHitN)(char)((uint)uVar1 >> 0x18);
                local_920[0x1c] = (RTCHitN)(char)uVar1;
                local_920[0x1d] = (RTCHitN)(char)((uint)uVar1 >> 8);
                local_920[0x1e] = (RTCHitN)(char)((uint)uVar1 >> 0x10);
                local_920[0x1f] = (RTCHitN)(char)((uint)uVar1 >> 0x18);
                auVar61 = vpcmpeqd_avx2(auVar77,auVar77);
                fStack_8bc = local_8c0;
                fStack_8b8 = local_8c0;
                fStack_8b4 = local_8c0;
                fStack_8b0 = local_8c0;
                fStack_8ac = local_8c0;
                fStack_8a8 = local_8c0;
                fStack_8a4 = local_8c0;
                fStack_89c = local_8a0;
                fStack_898 = local_8a0;
                fStack_894 = local_8a0;
                fStack_890 = local_8a0;
                fStack_88c = local_8a0;
                fStack_888 = local_8a0;
                fStack_884 = local_8a0;
                local_880 = local_ba0._0_8_;
                uStack_878 = local_ba0._8_8_;
                uStack_870 = local_ba0._16_8_;
                uStack_868 = local_ba0._24_8_;
                local_860 = local_c60;
                uStack_858 = uStack_c58;
                uStack_850 = uStack_c50;
                uStack_848 = uStack_c48;
                uStack_83c = (local_c30.context)->instID[0];
                local_840 = uStack_83c;
                uStack_838 = uStack_83c;
                uStack_834 = uStack_83c;
                uStack_830 = uStack_83c;
                uStack_82c = uStack_83c;
                uStack_828 = uStack_83c;
                uStack_824 = uStack_83c;
                uStack_81c = (local_c30.context)->instPrimID[0];
                local_820 = uStack_81c;
                uStack_818 = uStack_81c;
                uStack_814 = uStack_81c;
                uStack_810 = uStack_81c;
                uStack_80c = uStack_81c;
                uStack_808 = uStack_81c;
                uStack_804 = uStack_81c;
                local_b80 = local_b40;
                local_c30.valid = (int *)local_b80;
                local_c30.geometryUserPtr = pGVar56->userPtr;
                local_c30.hit = local_920;
                local_c30.N = 8;
                local_c30.ray = (RTCRayN *)ray;
                if (pGVar56->occlusionFilterN != (RTCFilterFunctionN)0x0) {
                  auVar61 = ZEXT1632(auVar61._0_16_);
                  (*pGVar56->occlusionFilterN)(&local_c30);
                  auVar61 = vpcmpeqd_avx2(auVar61,auVar61);
                  pGVar56 = local_c00;
                }
                auVar89 = vpcmpeqd_avx2(local_b80,_DAT_01f7b000);
                auVar62 = auVar61 & ~auVar89;
                if ((((((((auVar62 >> 0x1f & (undefined1  [32])0x1) == (undefined1  [32])0x0 &&
                         (auVar62 >> 0x3f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                        (auVar62 >> 0x5f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                       SUB321(auVar62 >> 0x7f,0) == '\0') &&
                      (auVar62 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
                     SUB321(auVar62 >> 0xbf,0) == '\0') &&
                    (auVar62 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
                    -1 < auVar62[0x1f]) {
                  auVar89 = auVar89 ^ auVar61;
                }
                else {
                  p_Var9 = context->args->filter;
                  if ((p_Var9 != (RTCFilterFunctionN)0x0) &&
                     (((context->args->flags & RTC_RAY_QUERY_FLAG_INVOKE_ARGUMENT_FILTER) !=
                       RTC_RAY_QUERY_FLAG_INCOHERENT || (((pGVar56->field_8).field_0x2 & 0x40) != 0)
                      ))) {
                    auVar61 = ZEXT1632(auVar61._0_16_);
                    (*p_Var9)(&local_c30);
                    auVar61 = vpcmpeqd_avx2(auVar61,auVar61);
                    pGVar56 = local_c00;
                  }
                  auVar62 = vpcmpeqd_avx2(local_b80,_DAT_01f7b000);
                  auVar89 = auVar62 ^ auVar61;
                  auVar78._8_4_ = 0xff800000;
                  auVar78._0_8_ = 0xff800000ff800000;
                  auVar78._12_4_ = 0xff800000;
                  auVar78._16_4_ = 0xff800000;
                  auVar78._20_4_ = 0xff800000;
                  auVar78._24_4_ = 0xff800000;
                  auVar78._28_4_ = 0xff800000;
                  auVar61 = vblendvps_avx(auVar78,*(undefined1 (*) [32])(local_c30.ray + 0x100),
                                          auVar62);
                  *(undefined1 (*) [32])(local_c30.ray + 0x100) = auVar61;
                }
                if ((((((((auVar89 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
                         (auVar89 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                        (auVar89 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                       SUB321(auVar89 >> 0x7f,0) != '\0') ||
                      (auVar89 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
                     SUB321(auVar89 >> 0xbf,0) != '\0') ||
                    (auVar89 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
                    auVar89[0x1f] < '\0') goto LAB_01619c75;
                *(int *)(ray + k * 4 + 0x100) = local_bc0._0_4_;
                lVar50 = 0;
                uVar49 = uVar49 ^ 1L << (local_ca0._0_8_ & 0x3f);
                for (uVar52 = uVar49; (uVar52 & 1) == 0; uVar52 = uVar52 >> 1 | 0x8000000000000000)
                {
                  lVar50 = lVar50 + 1;
                }
              }
            }
          }
        }
      }
      goto LAB_01618fa2;
    }
    pGVar53 = (GridSOA *)(uVar52 & 0xfffffffffffffff0);
    uVar52 = *(ulong *)(pGVar53 + (ulong)*(uint *)(pGVar53 + 0x2c) + 0x30);
    (pre->super_Precalculations).grid = pGVar53;
    if (uVar52 != 0) {
      *local_dc0 = uVar52;
      local_dc0 = local_dc0 + 1;
    }
  } while( true );
}

Assistant:

bool BVHNIntersectorKHybrid<N, K, types, robust, PrimitiveIntersectorK, single>::occluded1(Accel::Intersectors* This,
                                                                                               const BVH* bvh,
                                                                                               NodeRef root,
                                                                                               size_t k,
                                                                                               Precalculations& pre,
                                                                                               RayK<K>& ray,
                                                                                               const TravRayK<K, robust>& tray,
                                                                                               RayQueryContext* context)
      {
        /* stack state */
        NodeRef stack[stackSizeSingle];  // stack of nodes that still need to get traversed
        NodeRef* stackPtr = stack+1;     // current stack pointer
	NodeRef* stackEnd = stack+stackSizeSingle;
        stack[0] = root;

        /* load the ray into SIMD registers */
        TravRay<N,robust> tray1;
        tray1.template init<K>(k, tray.org, tray.dir, tray.rdir, tray.nearXYZ, tray.tnear[k], tray.tfar[k]);

	/* pop loop */
	while (true) pop:
	{
          /* pop next node */
	  if (unlikely(stackPtr == stack)) break;
	  stackPtr--;
          NodeRef cur = (NodeRef)*stackPtr;

          /* downtraversal loop */
          while (true)
          {
            /* intersect node */
            size_t mask; vfloat<N> tNear;
            STAT3(shadow.trav_nodes, 1, 1, 1);
            bool nodeIntersected = BVHNNodeIntersector1<N, types, robust>::intersect(cur, tray1, ray.time()[k], tNear, mask);
            if (unlikely(!nodeIntersected)) { STAT3(shadow.trav_nodes,-1,-1,-1); break; }

            /* if no child is hit, pop next node */
            if (unlikely(mask == 0))
              goto pop;

            /* select next child and push other children */
            BVHNNodeTraverser1Hit<N, types>::traverseAnyHit(cur, mask, tNear, stackPtr, stackEnd);
          }

          /* this is a leaf node */
          assert(cur != BVH::emptyNode);
          STAT3(shadow.trav_leaves, 1, 1, 1);
          size_t num; Primitive* prim = (Primitive*)cur.leaf(num);

          size_t lazy_node = 0;
          if (PrimitiveIntersectorK::occluded(This, pre, ray, k, context, prim, num, tray1, lazy_node)) {
	    ray.tfar[k] = neg_inf;
	    return true;
	  }

          if (unlikely(lazy_node)) {
            *stackPtr = lazy_node;
            stackPtr++;
          }
	}
	return false;
      }